

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tst_signal.cpp
# Opt level: O2

void tst_signal_basic(void)

{
  uint __line;
  __type _Var1;
  ostream *poVar2;
  socklen_t sVar3;
  float *pfVar4;
  void *pvVar5;
  int *piVar6;
  char *__assertion;
  _Any_data local_268;
  code *local_258;
  code *local_250;
  code *local_248 [2];
  code *local_238;
  code *local_230;
  _Any_data local_228;
  code *local_218;
  code *local_210;
  code *local_208 [2];
  code *local_1f8;
  code *local_1f0;
  code *local_1e8 [2];
  code *local_1d8;
  code *local_1d0;
  undefined1 local_1c8 [8];
  SignalHandler_Function<int> intLambda;
  SignalHandler_Function<int> intCFunc;
  SignalHandler_Function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_float,_float>
  stringFloatFloatLambda;
  SignalHandler_Function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_float,_float>
  stringFloatFloatCFunc;
  SignalHandler_Function<> voidLambda;
  SignalHandler_Function<> voidCFunc;
  _Any_data local_b8;
  code *local_a8;
  code *pcStack_a0;
  undefined1 local_90 [8];
  string emitted_string;
  Signal<int> signal_int;
  Signal<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_float,_float>
  signal_string_float_float;
  Signal<> local_40;
  Signal<> signal_void;
  SignalEmitter emitter;
  int emitted_int;
  float emitted_float1;
  float emitted_float2;
  bool called_void;
  bool called_int;
  bool called_string_float_float;
  
  pfVar4 = &emitted_float1;
  emitted_float1._0_1_ = '\0';
  emitted_float1._1_1_ = '\0';
  emitted_float1._2_1_ = '\0';
  signal_void.super_SignalBase._vptr_SignalBase = (SignalBase)&PTR__SignalEmitter_001159d8;
  emitter._vptr_SignalEmitter = (_func_int **)0x0;
  local_268._8_8_ = 0;
  local_250 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_signal.cpp:37:41)>
              ::_M_invoke;
  local_258 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_signal.cpp:37:41)>
              ::_M_manager;
  local_268._M_unused._0_8_ = (undefined8)pfVar4;
  rengine::SignalHandler_Function<>::SignalHandler_Function
            ((SignalHandler_Function<> *)&stringFloatFloatCFunc.m_handler._M_invoker,
             (function<void_()> *)&local_268);
  sVar3 = (socklen_t)pfVar4;
  std::_Function_base::~_Function_base((_Function_base *)&local_268);
  local_248[1] = (code *)0x0;
  local_248[0] = cfunc_void;
  local_230 = std::_Function_handler<void_(),_void_(*)()>::_M_invoke;
  local_238 = std::_Function_handler<void_(),_void_(*)()>::_M_manager;
  rengine::SignalHandler_Function<>::SignalHandler_Function
            ((SignalHandler_Function<> *)&voidLambda.m_handler._M_invoker,
             (function<void_()> *)local_248);
  std::_Function_base::~_Function_base((_Function_base *)local_248);
  local_40.super_SignalBase._vptr_SignalBase = (SignalBase)&PTR__SignalBase_00115980;
  rengine::Signal<>::connect
            (&local_40,(int)&signal_void,(sockaddr *)&stringFloatFloatCFunc.m_handler._M_invoker,
             sVar3);
  rengine::Signal<>::connect
            (&local_40,(int)&signal_void,(sockaddr *)&voidLambda.m_handler._M_invoker,sVar3);
  rengine::Signal<>::emit(&local_40,(SignalEmitter *)&signal_void);
  if (cfunc_void_called == false) {
    __assertion = "cfunc_void_called";
    __line = 0x2c;
  }
  else if (emitted_float1._0_1_ == '\0') {
    __assertion = "called_void";
    __line = 0x2d;
  }
  else {
    rengine::Signal<>::disconnect
              (&local_40,(SignalEmitter *)&signal_void,
               (SignalHandler<> *)&voidLambda.m_handler._M_invoker);
    rengine::Signal<>::disconnect
              (&local_40,(SignalEmitter *)&signal_void,
               (SignalHandler<> *)&stringFloatFloatCFunc.m_handler._M_invoker);
    local_228._8_8_ = &emitter.m_buckets;
    emitter.m_buckets._0_4_ = 0;
    pvVar5 = (void *)((long)&emitted_float1 + 1);
    local_210 = std::
                _Function_handler<void_(int),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_signal.cpp:50:43)>
                ::_M_invoke;
    local_218 = std::
                _Function_handler<void_(int),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_signal.cpp:50:43)>
                ::_M_manager;
    local_228._M_unused._0_8_ = (undefined8)pvVar5;
    rengine::SignalHandler_Function<int>::SignalHandler_Function
              ((SignalHandler_Function<int> *)local_1c8,(function<void_(int)> *)&local_228);
    sVar3 = (socklen_t)pvVar5;
    std::_Function_base::~_Function_base((_Function_base *)&local_228);
    local_208[1] = (code *)0x0;
    local_208[0] = cfunc_int;
    local_1f0 = std::_Function_handler<void_(int),_void_(*)(int)>::_M_invoke;
    local_1f8 = std::_Function_handler<void_(int),_void_(*)(int)>::_M_manager;
    rengine::SignalHandler_Function<int>::SignalHandler_Function
              ((SignalHandler_Function<int> *)&intLambda.m_handler._M_invoker,
               (function<void_(int)> *)local_208);
    std::_Function_base::~_Function_base((_Function_base *)local_208);
    emitted_string.field_2._8_8_ = &PTR__SignalBase_00115a08;
    rengine::Signal<int>::connect
              ((Signal<int> *)((long)&emitted_string.field_2 + 8),(int)&signal_void,
               (sockaddr *)local_1c8,sVar3);
    rengine::Signal<int>::connect
              ((Signal<int> *)((long)&emitted_string.field_2 + 8),(int)&signal_void,
               (sockaddr *)&intLambda.m_handler._M_invoker,sVar3);
    rengine::Signal<int>::emit
              ((Signal<int> *)((long)&emitted_string.field_2 + 8),(SignalEmitter *)&signal_void,0x2a
              );
    if (emitted_float1._1_1_ == '\0') {
      __assertion = "called_int";
      __line = 0x3b;
    }
    else if (cfunc_int_called == false) {
      __assertion = "cfunc_int_called";
      __line = 0x3c;
    }
    else {
      if ((int)emitter.m_buckets != 0x2a) {
        poVar2 = std::operator<<((ostream *)&std::cout,"Not equal \'");
        poVar2 = (ostream *)std::ostream::operator<<(poVar2,(int)emitter.m_buckets);
        poVar2 = std::operator<<(poVar2,"\' vs \'");
        poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x2a);
        poVar2 = std::operator<<(poVar2,"\'");
        std::endl<char,std::char_traits<char>>(poVar2);
        if ((int)emitter.m_buckets != 0x2a) {
          __assertion = "(emitted_int) == (42)";
          __line = 0x3d;
          goto LAB_0010e55b;
        }
      }
      if (cfuncvalue_int != 0x2a) {
        poVar2 = std::operator<<((ostream *)&std::cout,"Not equal \'");
        poVar2 = (ostream *)std::ostream::operator<<(poVar2,cfuncvalue_int);
        poVar2 = std::operator<<(poVar2,"\' vs \'");
        poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x2a);
        poVar2 = std::operator<<(poVar2,"\'");
        std::endl<char,std::char_traits<char>>(poVar2);
        if (cfuncvalue_int != 0x2a) {
          __assertion = "(cfuncvalue_int) == (42)";
          __line = 0x3e;
          goto LAB_0010e55b;
        }
      }
      local_90 = (undefined1  [8])&emitted_string._M_string_length;
      emitted_string._M_dataplus._M_p = (pointer)0x0;
      emitter.m_buckets._4_4_ = 0.0;
      emitted_int = 0;
      emitted_string._M_string_length._0_1_ = 0;
      local_b8._M_unused._M_object = (void *)0x0;
      local_b8._8_8_ = 0;
      local_a8 = (code *)0x0;
      pcStack_a0 = (code *)0x0;
      local_b8._M_unused._M_object = operator_new(0x20);
      *(long *)local_b8._M_unused._0_8_ = (long)&emitted_float1 + 2;
      *(undefined1 **)((long)local_b8._M_unused._0_8_ + 8) = local_90;
      *(undefined1 **)((long)local_b8._M_unused._0_8_ + 0x10) =
           (undefined1 *)((long)&emitter.m_buckets + 4);
      piVar6 = &emitted_int;
      *(int **)((long)local_b8._M_unused._0_8_ + 0x18) = piVar6;
      pcStack_a0 = std::
                   _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_float,_float),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_signal.cpp:67:78)>
                   ::_M_invoke;
      local_a8 = std::
                 _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_float,_float),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_signal.cpp:67:78)>
                 ::_M_manager;
      rengine::
      SignalHandler_Function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_float,_float>
      ::SignalHandler_Function
                ((SignalHandler_Function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_float,_float>
                  *)&intCFunc.m_handler._M_invoker,
                 (function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_float,_float)>
                  *)&local_b8);
      sVar3 = (socklen_t)piVar6;
      std::_Function_base::~_Function_base((_Function_base *)&local_b8);
      local_1e8[1] = (code *)0x0;
      local_1e8[0] = cfunc_string_float_float;
      local_1d0 = std::
                  _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_float,_float),_void_(*)(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_float,_float)>
                  ::_M_invoke;
      local_1d8 = std::
                  _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_float,_float),_void_(*)(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_float,_float)>
                  ::_M_manager;
      rengine::
      SignalHandler_Function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_float,_float>
      ::SignalHandler_Function
                ((SignalHandler_Function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_float,_float>
                  *)&stringFloatFloatLambda.m_handler._M_invoker,
                 (function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_float,_float)>
                  *)local_1e8);
      std::_Function_base::~_Function_base((_Function_base *)local_1e8);
      signal_int.super_SignalBase._vptr_SignalBase = (SignalBase)&PTR__SignalBase_00115a50;
      rengine::
      Signal<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_float,_float>
      ::connect((Signal<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_float,_float>
                 *)&signal_int,(int)&signal_void,(sockaddr *)&intCFunc.m_handler._M_invoker,sVar3);
      rengine::
      Signal<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_float,_float>
      ::connect((Signal<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_float,_float>
                 *)&signal_int,(int)&signal_void,
                (sockaddr *)&stringFloatFloatLambda.m_handler._M_invoker,sVar3);
      std::__cxx11::string::string
                ((string *)&voidCFunc.m_handler._M_invoker,"one",
                 (allocator *)&signal_string_float_float);
      rengine::
      Signal<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_float,_float>
      ::emit((Signal<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_float,_float>
              *)&signal_int,(SignalEmitter *)&signal_void,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &voidCFunc.m_handler._M_invoker,2.0,3.0);
      std::__cxx11::string::~string((string *)&voidCFunc.m_handler._M_invoker);
      if (emitted_float1._2_1_ == '\0') {
        __assertion = "called_string_float_float";
        __line = 0x4e;
      }
      else {
        if (cfunc_string_float_float_called != false) {
          std::__cxx11::string::string
                    ((string *)&signal_string_float_float,"one",
                     (allocator *)((long)&emitted_float1 + 3));
          _Var1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)local_90,
                                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)&signal_string_float_float);
          std::__cxx11::string::~string((string *)&signal_string_float_float);
          if (!_Var1) {
            poVar2 = std::operator<<((ostream *)&std::cout,"Not equal \'");
            poVar2 = std::operator<<(poVar2,(string *)local_90);
            poVar2 = std::operator<<(poVar2,"\' vs \'");
            std::__cxx11::string::string
                      ((string *)&signal_string_float_float,"one",
                       (allocator *)((long)&emitted_float1 + 3));
            poVar2 = std::operator<<(poVar2,(string *)&signal_string_float_float);
            poVar2 = std::operator<<(poVar2,"\'");
            std::endl<char,std::char_traits<char>>(poVar2);
            std::__cxx11::string::~string((string *)&signal_string_float_float);
            std::__cxx11::string::string
                      ((string *)&signal_string_float_float,"one",
                       (allocator *)((long)&emitted_float1 + 3));
            _Var1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)local_90,
                                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)&signal_string_float_float);
            if (!_Var1) {
              __assertion = "(emitted_string) == (std::string(\"one\"))";
              __line = 0x50;
              goto LAB_0010e55b;
            }
            std::__cxx11::string::~string((string *)&signal_string_float_float);
          }
          if ((emitter.m_buckets._4_4_ != 2.0) || (NAN(emitter.m_buckets._4_4_))) {
            poVar2 = std::operator<<((ostream *)&std::cout,"Not equal \'");
            poVar2 = (ostream *)std::ostream::operator<<(poVar2,emitter.m_buckets._4_4_);
            std::operator<<(poVar2,"\' vs \'");
            poVar2 = std::ostream::_M_insert<double>(2.0);
            poVar2 = std::operator<<(poVar2,"\'");
            std::endl<char,std::char_traits<char>>(poVar2);
            if ((emitter.m_buckets._4_4_ != 2.0) || (NAN(emitter.m_buckets._4_4_))) {
              __assertion = "(emitted_float1) == (2.0f)";
              __line = 0x51;
              goto LAB_0010e55b;
            }
          }
          if (((float)emitted_int != 3.0) || (NAN((float)emitted_int))) {
            poVar2 = std::operator<<((ostream *)&std::cout,"Not equal \'");
            poVar2 = (ostream *)std::ostream::operator<<(poVar2,(float)emitted_int);
            std::operator<<(poVar2,"\' vs \'");
            poVar2 = std::ostream::_M_insert<double>(3.0);
            poVar2 = std::operator<<(poVar2,"\'");
            std::endl<char,std::char_traits<char>>(poVar2);
            if (((float)emitted_int != 3.0) || (NAN((float)emitted_int))) {
              __assertion = "(emitted_float2) == (3.0f)";
              __line = 0x52;
              goto LAB_0010e55b;
            }
          }
          std::__cxx11::string::string
                    ((string *)&signal_string_float_float,"one",
                     (allocator *)((long)&emitted_float1 + 3));
          _Var1 = std::operator==(&cfuncvalue_string_abi_cxx11_,
                                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)&signal_string_float_float);
          std::__cxx11::string::~string((string *)&signal_string_float_float);
          if (!_Var1) {
            poVar2 = std::operator<<((ostream *)&std::cout,"Not equal \'");
            poVar2 = std::operator<<(poVar2,(string *)&cfuncvalue_string_abi_cxx11_);
            poVar2 = std::operator<<(poVar2,"\' vs \'");
            std::__cxx11::string::string
                      ((string *)&signal_string_float_float,"one",
                       (allocator *)((long)&emitted_float1 + 3));
            poVar2 = std::operator<<(poVar2,(string *)&signal_string_float_float);
            poVar2 = std::operator<<(poVar2,"\'");
            std::endl<char,std::char_traits<char>>(poVar2);
            std::__cxx11::string::~string((string *)&signal_string_float_float);
            std::__cxx11::string::string
                      ((string *)&signal_string_float_float,"one",
                       (allocator *)((long)&emitted_float1 + 3));
            _Var1 = std::operator==(&cfuncvalue_string_abi_cxx11_,
                                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)&signal_string_float_float);
            if (!_Var1) {
              __assertion = "(cfuncvalue_string) == (std::string(\"one\"))";
              __line = 0x53;
              goto LAB_0010e55b;
            }
            std::__cxx11::string::~string((string *)&signal_string_float_float);
          }
          if ((cfuncvalue_float1 != 2.0) || (NAN(cfuncvalue_float1))) {
            poVar2 = std::operator<<((ostream *)&std::cout,"Not equal \'");
            poVar2 = (ostream *)std::ostream::operator<<(poVar2,cfuncvalue_float1);
            std::operator<<(poVar2,"\' vs \'");
            poVar2 = std::ostream::_M_insert<double>(2.0);
            poVar2 = std::operator<<(poVar2,"\'");
            std::endl<char,std::char_traits<char>>(poVar2);
            if ((cfuncvalue_float1 != 2.0) || (NAN(cfuncvalue_float1))) {
              __assertion = "(cfuncvalue_float1) == (2.0f)";
              __line = 0x54;
              goto LAB_0010e55b;
            }
          }
          if ((cfuncvalue_float2 != 3.0) || (NAN(cfuncvalue_float2))) {
            poVar2 = std::operator<<((ostream *)&std::cout,"Not equal \'");
            poVar2 = (ostream *)std::ostream::operator<<(poVar2,cfuncvalue_float2);
            std::operator<<(poVar2,"\' vs \'");
            poVar2 = std::ostream::_M_insert<double>(3.0);
            poVar2 = std::operator<<(poVar2,"\'");
            std::endl<char,std::char_traits<char>>(poVar2);
            if ((cfuncvalue_float2 != 3.0) || (NAN(cfuncvalue_float2))) {
              __assertion = "(cfuncvalue_float2) == (3.0f)";
              __line = 0x55;
              goto LAB_0010e55b;
            }
          }
          poVar2 = std::operator<<((ostream *)&std::cout,"void tst_signal_basic()");
          poVar2 = std::operator<<(poVar2,": ok");
          std::endl<char,std::char_traits<char>>(poVar2);
          rengine::
          SignalHandler_Function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_float,_float>
          ::~SignalHandler_Function
                    ((SignalHandler_Function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_float,_float>
                      *)&stringFloatFloatLambda.m_handler._M_invoker);
          rengine::
          SignalHandler_Function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_float,_float>
          ::~SignalHandler_Function
                    ((SignalHandler_Function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_float,_float>
                      *)&intCFunc.m_handler._M_invoker);
          std::__cxx11::string::~string((string *)local_90);
          rengine::SignalHandler_Function<int>::~SignalHandler_Function
                    ((SignalHandler_Function<int> *)&intLambda.m_handler._M_invoker);
          rengine::SignalHandler_Function<int>::~SignalHandler_Function
                    ((SignalHandler_Function<int> *)local_1c8);
          rengine::SignalHandler_Function<>::~SignalHandler_Function
                    ((SignalHandler_Function<> *)&voidLambda.m_handler._M_invoker);
          rengine::SignalHandler_Function<>::~SignalHandler_Function
                    ((SignalHandler_Function<> *)&stringFloatFloatCFunc.m_handler._M_invoker);
          rengine::SignalEmitter::~SignalEmitter((SignalEmitter *)&signal_void);
          return;
        }
        __assertion = "cfunc_string_float_float_called";
        __line = 0x4f;
      }
    }
  }
LAB_0010e55b:
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_signal.cpp"
                ,__line,"void tst_signal_basic()");
}

Assistant:

void tst_signal_basic()
{
    bool called_void = false;
    bool called_int = false;
    bool called_string_float_float = false;

    SignalEmitter emitter;

    SignalHandler_Function<> voidLambda([&]() { called_void = true; });
    SignalHandler_Function<> voidCFunc(cfunc_void);

    Signal<> signal_void;
    signal_void.connect(&emitter, &voidLambda);
    signal_void.connect(&emitter, &voidCFunc);
    signal_void.emit(&emitter);
    check_true(cfunc_void_called);
    check_true(called_void);
    signal_void.disconnect(&emitter, &voidCFunc);
    signal_void.disconnect(&emitter, &voidLambda);

    int emitted_int = 0;
    SignalHandler_Function<int> intLambda([&] (int value) {
        called_int = true;
        emitted_int = value;
    });
    SignalHandler_Function<int> intCFunc(cfunc_int);
    Signal<int> signal_int;
    signal_int.connect(&emitter, &intLambda);
    signal_int.connect(&emitter, &intCFunc);
    signal_int.emit(&emitter, 42);
    check_true(called_int);
    check_true(cfunc_int_called);
    check_equal(emitted_int, 42);
    check_equal(cfuncvalue_int, 42);

    std::string emitted_string;
    float emitted_float1 = 0;
    float emitted_float2 = 0;
    SignalHandler_Function<std::string, float, float> stringFloatFloatLambda([&](std::string str, float a, float b) {
        called_string_float_float = true;
        emitted_string = str;
        emitted_float1 = a;
        emitted_float2 = b;
    });
    SignalHandler_Function<std::string, float, float> stringFloatFloatCFunc(cfunc_string_float_float);
    Signal<std::string, float, float> signal_string_float_float;
    signal_string_float_float.connect(&emitter, &stringFloatFloatLambda);
    signal_string_float_float.connect(&emitter, &stringFloatFloatCFunc);
    signal_string_float_float.emit(&emitter, std::string("one"), 2.0f, 3.0f);
    check_true(called_string_float_float);
    check_true(cfunc_string_float_float_called);
    check_equal(emitted_string, std::string("one"));
    check_equal(emitted_float1, 2.0f);
    check_equal(emitted_float2, 3.0f);
    check_equal(cfuncvalue_string, std::string("one"));
    check_equal(cfuncvalue_float1, 2.0f);
    check_equal(cfuncvalue_float2, 3.0f);

    cout << __PRETTY_FUNCTION__ << ": ok" << endl;
}